

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_36::HttpClientAdapter::openWebSocket
          (HttpClientAdapter *this,StringPtr url,HttpHeaders *headers)

{
  undefined8 *puVar1;
  SourceLocation location;
  SourceLocation location_00;
  bool bVar2;
  HttpHeaders *pHVar3;
  Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>,_std::nullptr_t> *params;
  WebSocketResponseImpl *this_00;
  Promise<void> *pPVar4;
  RefOrVoid<kj::HttpHeaders> pHVar5;
  RefOrVoid<kj::NullStream> pNVar6;
  RefOrVoid<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl> pWVar7;
  Own<kj::NullStream,_std::nullptr_t> *attachments_1;
  Own<kj::HttpHeaders,_std::nullptr_t> *attachments_2;
  PromiseFulfiller<kj::Promise<void>_> *pPVar8;
  void *__child_stack;
  __fn *in_R8;
  __fn *__arg;
  undefined8 in_stack_fffffffffffffdd0;
  StringPtr local_1b0;
  Own<kj::NullStream,_std::nullptr_t> local_1a0;
  Promise<void> promise;
  Own<kj::NullStream,_std::nullptr_t> in;
  SourceLocation local_170;
  undefined1 local_158 [8];
  PromiseFulfillerPair<kj::Promise<void>_> requestPaf;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t> responder
  ;
  SourceLocation local_128;
  undefined1 local_110 [8];
  PromiseFulfillerPair<kj::HttpClient::WebSocketResponse> paf;
  Fault f;
  undefined1 auStack_e8 [7];
  DebugExpression<bool> _kjCondition;
  HttpHeaders local_b8;
  undefined1 local_58 [8];
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  String urlCopy;
  HttpHeaders *headers_local;
  HttpClientAdapter *this_local;
  StringPtr url_local;
  
  this_local = (HttpClientAdapter *)url.content.size_;
  __arg = in_R8;
  url_local.content.ptr = (char *)headers;
  url_local.content.size_ = (size_t)this;
  str<kj::StringPtr&>((String *)&headersCopy.ptr,(kj *)&this_local,(StringPtr *)this_local);
  HttpHeaders::clone(&local_b8,in_R8,__child_stack,(int)headers,__arg);
  heap<kj::HttpHeaders>((kj *)local_58,&local_b8);
  HttpHeaders::~HttpHeaders(&local_b8);
  pHVar3 = Own<kj::HttpHeaders,_std::nullptr_t>::operator->
                     ((Own<kj::HttpHeaders,_std::nullptr_t> *)local_58);
  StringPtr::StringPtr((StringPtr *)auStack_e8,"websocket");
  HttpHeaders::set(pHVar3,(HttpHeaderId)(ZEXT416(4) << 0x40),(StringPtr)_auStack_e8);
  pHVar3 = Own<kj::HttpHeaders,_std::nullptr_t>::operator->
                     ((Own<kj::HttpHeaders,_std::nullptr_t> *)local_58);
  f.exception._6_1_ = HttpHeaders::isWebSocket(pHVar3);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar2 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&paf.fulfiller.ptr,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1a52,FAILED,"headersCopy->isWebSocket()","_kjCondition,",
               (DebugExpression<bool> *)((long)&f.exception + 7));
    kj::_::Debug::Fault::fatal((Fault *)&paf.fulfiller.ptr);
  }
  SourceLocation::SourceLocation
            (&local_128,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"openWebSocket",0x1a54,0x10);
  location.function = (char *)local_128._16_8_;
  location.fileName = local_128.function;
  location.lineNumber = (int)in_stack_fffffffffffffdd0;
  location.columnNumber = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
  newPromiseAndFulfiller<kj::HttpClient::WebSocketResponse>(location);
  params = mv<kj::Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>,decltype(nullptr)>>
                     ((Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>,_std::nullptr_t>
                       *)&paf);
  refcounted<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,kj::Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>,decltype(nullptr)>>
            ((kj *)&requestPaf.fulfiller.ptr,params);
  SourceLocation::SourceLocation
            (&local_170,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"openWebSocket",0x1a57,0x17);
  location_00.function = (char *)local_170._16_8_;
  location_00.fileName = local_170.function;
  location_00.lineNumber = (int)in_stack_fffffffffffffdd0;
  location_00.columnNumber = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
  newPromiseAndFulfiller<kj::Promise<void>>(location_00);
  this_00 = Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
            ::operator->((Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
                          *)&requestPaf.fulfiller.ptr);
  pPVar4 = mv<kj::Promise<void>>((Promise<void> *)local_158);
  Promise<void>::Promise((Promise<void> *)&in.ptr,pPVar4);
  WebSocketResponseImpl::setPromise(this_00,(Promise<void> *)&in.ptr);
  Promise<void>::~Promise((Promise<void> *)&in.ptr);
  heap<kj::NullStream>();
  puVar1 = *(undefined8 **)(url.content.ptr + 8);
  StringPtr::StringPtr(&local_1b0,(String *)&headersCopy.ptr);
  pHVar5 = Own<kj::HttpHeaders,_std::nullptr_t>::operator*
                     ((Own<kj::HttpHeaders,_std::nullptr_t> *)local_58);
  pNVar6 = Own<kj::NullStream,_std::nullptr_t>::operator*
                     ((Own<kj::NullStream,_std::nullptr_t> *)&promise);
  pWVar7 = Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
           ::operator*((Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
                        *)&requestPaf.fulfiller.ptr);
  (**(code **)*puVar1)
            (&local_1a0,puVar1,0,local_1b0.content.ptr,local_1b0.content.size_,pHVar5,pNVar6,pWVar7)
  ;
  attachments_1 =
       mv<kj::Own<kj::NullStream,decltype(nullptr)>>
                 ((Own<kj::NullStream,_std::nullptr_t> *)&promise);
  attachments_2 = (Own<kj::HttpHeaders,_std::nullptr_t> *)mv<kj::String>((String *)&headersCopy.ptr)
  ;
  mv<kj::Own<kj::HttpHeaders,decltype(nullptr)>>((Own<kj::HttpHeaders,_std::nullptr_t> *)local_58);
  Promise<void>::
  attach<kj::Own<kj::NullStream,decltype(nullptr)>,kj::String,kj::Own<kj::HttpHeaders,decltype(nullptr)>>
            ((Promise<void> *)&local_1a0.ptr,&local_1a0,(String *)attachments_1,attachments_2);
  Promise<void>::~Promise((Promise<void> *)&local_1a0);
  pPVar8 = Own<kj::PromiseFulfiller<kj::Promise<void>_>,_std::nullptr_t>::operator->
                     ((Own<kj::PromiseFulfiller<kj::Promise<void>_>,_std::nullptr_t> *)&requestPaf);
  pPVar4 = mv<kj::Promise<void>>((Promise<void> *)&local_1a0.ptr);
  (*(pPVar8->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar8,pPVar4);
  mv<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,decltype(nullptr)>>
            ((Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
              *)&requestPaf.fulfiller.ptr);
  Promise<kj::HttpClient::WebSocketResponse>::
  attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,decltype(nullptr)>>
            ((Promise<kj::HttpClient::WebSocketResponse> *)this,
             (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
              *)local_110);
  Promise<void>::~Promise((Promise<void> *)&local_1a0.ptr);
  Own<kj::NullStream,_std::nullptr_t>::~Own((Own<kj::NullStream,_std::nullptr_t> *)&promise);
  PromiseFulfillerPair<kj::Promise<void>_>::~PromiseFulfillerPair
            ((PromiseFulfillerPair<kj::Promise<void>_> *)local_158);
  Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
              *)&requestPaf.fulfiller.ptr);
  PromiseFulfillerPair<kj::HttpClient::WebSocketResponse>::~PromiseFulfillerPair
            ((PromiseFulfillerPair<kj::HttpClient::WebSocketResponse> *)local_110);
  Own<kj::HttpHeaders,_std::nullptr_t>::~Own((Own<kj::HttpHeaders,_std::nullptr_t> *)local_58);
  String::~String((String *)&headersCopy.ptr);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<WebSocketResponse> openWebSocket(
      kj::StringPtr url, const HttpHeaders& headers) override {
    // We have to clone the URL and headers because HttpService implementation are allowed to
    // assume that they remain valid until the service handler completes whereas HttpClient callers
    // are allowed to destroy them immediately after the call. Also we need to add
    // `Upgrade: websocket` so that headers.isWebSocket() returns true on the service side.
    auto urlCopy = kj::str(url);
    auto headersCopy = kj::heap(headers.clone());
    headersCopy->set(HttpHeaderId::UPGRADE, "websocket");
    KJ_DASSERT(headersCopy->isWebSocket());

    auto paf = kj::newPromiseAndFulfiller<WebSocketResponse>();
    auto responder = kj::refcounted<WebSocketResponseImpl>(kj::mv(paf.fulfiller));

    auto requestPaf = kj::newPromiseAndFulfiller<kj::Promise<void>>();
    responder->setPromise(kj::mv(requestPaf.promise));

    auto in = kj::heap<kj::NullStream>();
    auto promise = service.request(HttpMethod::GET, urlCopy, *headersCopy, *in, *responder)
        .attach(kj::mv(in), kj::mv(urlCopy), kj::mv(headersCopy));
    requestPaf.fulfiller->fulfill(kj::mv(promise));

    return paf.promise.attach(kj::mv(responder));
  }